

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O0

term_conflict2 * find_first_subwindow(uint32_t flag)

{
  int local_18;
  wchar_t i;
  uint32_t flag_local;
  
  local_18 = 1;
  while( true ) {
    if (7 < local_18) {
      return (term_conflict2 *)0x0;
    }
    if (((window_flag[local_18] & flag) != 0) && (angband_term[local_18] != (term *)0x0)) break;
    local_18 = local_18 + 1;
  }
  return (term_conflict2 *)angband_term[local_18];
}

Assistant:

term *find_first_subwindow(uint32_t flag)
{
	int i = 1;

	while (1) {
		if (i >= ANGBAND_TERM_MAX) {
			return NULL;
		}
		if ((window_flag[i] & flag) && angband_term[i]) {
			return angband_term[i];
		}
		++i;
	}
}